

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O0

void __thiscall
deqp::gls::RandomShaderProgram::shadeFragments
          (RandomShaderProgram *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *pvVar2;
  size_type sVar3;
  const_reference ppSVar4;
  Variable *this_00;
  VariableType *this_01;
  float *pfVar5;
  float fVar6;
  float y_;
  float z_;
  float w_;
  ExecValueAccess EVar7;
  ConstStridedValueAccess<64> local_148;
  ConstStridedValueAccess<64> local_138;
  ConstStridedValueAccess<64> local_128;
  ConstStridedValueAccess<64> local_118;
  undefined1 local_104 [8];
  Vec4 color;
  int srcNdx;
  int fragNdx_1;
  int packetNdx_1;
  ConstStridedValueAccess<64> local_d8;
  ConstStridedValueAccess<64> local_c8;
  ConstStridedValueAccess<64> local_b8;
  int local_a8;
  undefined1 local_a4 [4];
  int dstNdx;
  Vec4 varValue;
  int fragNdx;
  FragmentPacket *packet;
  undefined1 auStack_80 [4];
  int packetNdx;
  ExecValueAccess access;
  int numComponents;
  VariableType *varType;
  Variable *var;
  int varNdx;
  int numPacketsToExecute;
  int packetOffset;
  Scalar *local_40;
  undefined1 local_38 [8];
  ExecConstValueAccess fragColorAccess;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  RandomShaderProgram *this_local;
  
  fragColorAccess.m_value = (Scalar *)context;
  EVar7 = rsg::ExecutionContext::getValue(&this->m_execCtx,this->m_fragColorVar);
  _numPacketsToExecute = EVar7.super_ConstStridedValueAccess<64>.m_type;
  local_38 = (undefined1  [8])_numPacketsToExecute;
  local_40 = EVar7.super_ConstStridedValueAccess<64>.m_value;
  fragColorAccess.m_type = (VariableType *)local_40;
  for (varNdx = 0; varNdx < numPackets; varNdx = iVar1 + varNdx) {
    iVar1 = de::min<int>(numPackets - varNdx,0x10);
    var._4_4_ = 0;
    while( true ) {
      pvVar2 = rsg::Shader::getInputs(this->m_fragmentShader);
      sVar3 = std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::size(pvVar2);
      if ((int)sVar3 <= var._4_4_) break;
      pvVar2 = rsg::Shader::getInputs(this->m_fragmentShader);
      ppSVar4 = std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::operator[]
                          (pvVar2,(long)var._4_4_);
      this_00 = rsg::ShaderInput::getVariable(*ppSVar4);
      this_01 = rsg::Variable::getType(this_00);
      access.super_ConstStridedValueAccess<64>.m_value._4_4_ =
           rsg::VariableType::getNumElements(this_01);
      _auStack_80 = (ConstStridedValueAccess<64>)
                    rsg::ExecutionContext::getValue(&this->m_execCtx,this_00);
      for (packet._4_4_ = 0; packet._4_4_ < iVar1; packet._4_4_ = packet._4_4_ + 1) {
        register0x00000000 = packets + (varNdx + packet._4_4_);
        for (varValue.m_data[2] = 0.0; (int)varValue.m_data[2] < 4;
            varValue.m_data[2] = (float)((int)varValue.m_data[2] + 1)) {
          rr::readVarying<float>
                    ((rr *)local_a4,stack0xffffffffffffff70,
                     (FragmentShadingContext *)fragColorAccess.m_value,var._4_4_,
                     (int)varValue.m_data[2]);
          local_a8 = packet._4_4_ * 4 + (int)varValue.m_data[2];
          pfVar5 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,0);
          fVar6 = *pfVar5;
          local_b8 = (ConstStridedValueAccess<64>)
                     rsg::StridedValueAccess<64>::component((StridedValueAccess<64> *)auStack_80,0);
          pfVar5 = rsg::StridedValueAccess<64>::asFloat
                             ((StridedValueAccess<64> *)&local_b8,local_a8);
          *pfVar5 = fVar6;
          if (1 < access.super_ConstStridedValueAccess<64>.m_value._4_4_) {
            pfVar5 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,1);
            fVar6 = *pfVar5;
            local_c8 = (ConstStridedValueAccess<64>)
                       rsg::StridedValueAccess<64>::component
                                 ((StridedValueAccess<64> *)auStack_80,1);
            pfVar5 = rsg::StridedValueAccess<64>::asFloat
                               ((StridedValueAccess<64> *)&local_c8,local_a8);
            *pfVar5 = fVar6;
          }
          if (2 < access.super_ConstStridedValueAccess<64>.m_value._4_4_) {
            pfVar5 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,2);
            fVar6 = *pfVar5;
            local_d8 = (ConstStridedValueAccess<64>)
                       rsg::StridedValueAccess<64>::component
                                 ((StridedValueAccess<64> *)auStack_80,2);
            pfVar5 = rsg::StridedValueAccess<64>::asFloat
                               ((StridedValueAccess<64> *)&local_d8,local_a8);
            *pfVar5 = fVar6;
          }
          if (3 < access.super_ConstStridedValueAccess<64>.m_value._4_4_) {
            pfVar5 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_a4,3);
            fVar6 = *pfVar5;
            _fragNdx_1 = (ConstStridedValueAccess<64>)
                         rsg::StridedValueAccess<64>::component
                                   ((StridedValueAccess<64> *)auStack_80,3);
            pfVar5 = rsg::StridedValueAccess<64>::asFloat
                               ((StridedValueAccess<64> *)&fragNdx_1,local_a8);
            *pfVar5 = fVar6;
          }
        }
      }
      var._4_4_ = var._4_4_ + 1;
    }
    rsg::Shader::execute(this->m_fragmentShader,&this->m_execCtx);
    for (srcNdx = 0; srcNdx < iVar1; srcNdx = srcNdx + 1) {
      for (color.m_data[3] = 0.0; (int)color.m_data[3] < 4;
          color.m_data[3] = (float)((int)color.m_data[3] + 1)) {
        color.m_data[2] = (float)(srcNdx * 4 + (int)color.m_data[3]);
        local_118 = rsg::ConstStridedValueAccess<64>::component
                              ((ConstStridedValueAccess<64> *)local_38,0);
        fVar6 = rsg::ConstStridedValueAccess<64>::asFloat(&local_118,(int)color.m_data[2]);
        local_128 = rsg::ConstStridedValueAccess<64>::component
                              ((ConstStridedValueAccess<64> *)local_38,1);
        y_ = rsg::ConstStridedValueAccess<64>::asFloat(&local_128,(int)color.m_data[2]);
        local_138 = rsg::ConstStridedValueAccess<64>::component
                              ((ConstStridedValueAccess<64> *)local_38,2);
        z_ = rsg::ConstStridedValueAccess<64>::asFloat(&local_138,(int)color.m_data[2]);
        local_148 = rsg::ConstStridedValueAccess<64>::component
                              ((ConstStridedValueAccess<64> *)local_38,3);
        w_ = rsg::ConstStridedValueAccess<64>::asFloat(&local_148,(int)color.m_data[2]);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_104,fVar6,y_,z_,w_);
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  ((FragmentShadingContext *)fragColorAccess.m_value,varNdx + srcNdx,
                   (int)color.m_data[3],0,(Vector<float,_4> *)local_104);
      }
    }
  }
  return;
}

Assistant:

void RandomShaderProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const rsg::ExecConstValueAccess	fragColorAccess	= m_execCtx.getValue(m_fragColorVar);
	int								packetOffset	= 0;

	DE_STATIC_ASSERT(rsg::EXEC_VEC_WIDTH % rr::NUM_FRAGMENTS_PER_PACKET == 0);

	while (packetOffset < numPackets)
	{
		const int	numPacketsToExecute	= de::min(numPackets-packetOffset, (int)rsg::EXEC_VEC_WIDTH / (int)rr::NUM_FRAGMENTS_PER_PACKET);

		// Interpolate varyings.
		for (int varNdx = 0; varNdx < (int)m_fragmentShader.getInputs().size(); ++varNdx)
		{
			const rsg::Variable*		var				= m_fragmentShader.getInputs()[varNdx]->getVariable();
			const rsg::VariableType&	varType			= var->getType();
			const int					numComponents	= varType.getNumElements();
			rsg::ExecValueAccess		access			= m_execCtx.getValue(var);

			DE_ASSERT(varType.isFloatOrVec() && de::inRange(numComponents, 1, 4));

			for (int packetNdx = 0; packetNdx < numPacketsToExecute; packetNdx++)
			{
				const rr::FragmentPacket&	packet		= packets[packetOffset+packetNdx];

				for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
				{
					const tcu::Vec4		varValue	= rr::readVarying<float>(packet, context, varNdx, fragNdx);
					const int			dstNdx		= packetNdx*rr::NUM_FRAGMENTS_PER_PACKET + fragNdx;

											access.component(0).asFloat(dstNdx) = varValue[0];
					if (numComponents >= 2)	access.component(1).asFloat(dstNdx) = varValue[1];
					if (numComponents >= 3)	access.component(2).asFloat(dstNdx) = varValue[2];
					if (numComponents >= 4)	access.component(3).asFloat(dstNdx) = varValue[3];
				}
			}
		}

		m_fragmentShader.execute(m_execCtx);

		// Store color
		for (int packetNdx = 0; packetNdx < numPacketsToExecute; packetNdx++)
		{
			for (int fragNdx = 0; fragNdx < rr::NUM_FRAGMENTS_PER_PACKET; fragNdx++)
			{
				const int		srcNdx	= packetNdx*rr::NUM_FRAGMENTS_PER_PACKET + fragNdx;
				const tcu::Vec4 color	(fragColorAccess.component(0).asFloat(srcNdx),
										 fragColorAccess.component(1).asFloat(srcNdx),
										 fragColorAccess.component(2).asFloat(srcNdx),
										 fragColorAccess.component(3).asFloat(srcNdx));

				rr::writeFragmentOutput(context, packetOffset+packetNdx, fragNdx, 0, color);
			}
		}

		packetOffset += numPacketsToExecute;
	}
}